

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

Id dxil_spv::build_vectorized_physical_load_store_access
             (Impl *impl,CallInst *instruction,uint vecsize,Type *element_type)

{
  uint stride;
  Type *type;
  CallInst *impl_00;
  Value *pVVar1;
  mapped_type *pmVar2;
  Value *byte_offset;
  BufferAccessInfo BVar3;
  byte bVar4;
  Id local_50;
  BufferAccessInfo access;
  bool can_vectorize;
  uint mask;
  mapped_type *meta;
  Type *pTStack_30;
  Id ptr_id;
  Type *element_type_local;
  CallInst *pCStack_20;
  uint vecsize_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  pTStack_30 = element_type;
  element_type_local._4_4_ = vecsize;
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  pVVar1 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  meta._4_4_ = Converter::Impl::get_id_for_value(impl,pVVar1,0);
  pmVar2 = std::
           unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
           ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                         *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                            _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
  impl_00 = instruction_local;
  type = pTStack_30;
  bVar4 = (byte)element_type_local._4_4_;
  if (pmVar2->stride == 0) {
    pVVar1 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,2);
    access.index_id._3_1_ =
         raw_access_byte_address_can_vectorize((Impl *)impl_00,type,pVVar1,element_type_local._4_4_)
    ;
  }
  else {
    pVVar1 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,2);
    stride = pmVar2->stride;
    byte_offset = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,3);
    access.index_id._3_1_ =
         raw_access_structured_can_vectorize
                   ((Impl *)impl_00,type,pVVar1,stride,byte_offset,element_type_local._4_4_);
  }
  if (access.index_id._3_1_ == false) {
    impl_local._4_4_ = 0;
  }
  else {
    BVar3 = build_buffer_access((Impl *)instruction_local,pCStack_20,0,0,pTStack_30,
                                (1 << (bVar4 & 0x1f)) - 1);
    local_50 = BVar3.index_id;
    impl_local._4_4_ = local_50;
  }
  return impl_local._4_4_;
}

Assistant:

static spv::Id build_vectorized_physical_load_store_access(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                           unsigned vecsize, const llvm::Type *element_type)
{
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[ptr_id];
	unsigned mask = (1u << vecsize) - 1u;

	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	bool can_vectorize = false;

	if (meta.stride)
	{
		if (raw_access_structured_can_vectorize(impl, element_type,
		                                        instruction->getOperand(2), meta.stride,
		                                        instruction->getOperand(3), vecsize))
		{
			can_vectorize = true;
		}
	}
	else if (raw_access_byte_address_can_vectorize(impl, element_type,
	                                               instruction->getOperand(2), vecsize))
	{
		can_vectorize = true;
	}

	if (can_vectorize)
	{
		auto access = build_buffer_access(impl, instruction, 0, 0, element_type, mask);
		return access.index_id;
	}
	else
		return 0;
}